

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O0

int __thiscall amrex::BndryRegister::init(BndryRegister *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  BoxArray *pBVar2;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<double> dfab;
  Array4<const_double> sfab;
  Box *bx;
  FabSetIter mfi;
  int ncomp;
  int idim;
  BoxArray *in_stack_fffffffffffffd88;
  BoxArray *in_stack_fffffffffffffd90;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int in_stack_fffffffffffffdfc;
  DistributionMapping *in_stack_fffffffffffffe00;
  BoxArray *in_stack_fffffffffffffe08;
  FabSet *in_stack_fffffffffffffe10;
  long local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  int local_1a0;
  int local_19c;
  int local_198;
  undefined1 local_17c [36];
  BoxArray local_158;
  EVP_PKEY_CTX *local_f0;
  BndryRegister *local_e8;
  undefined8 local_e0;
  int local_d8;
  BoxArray *local_d0;
  int local_c4;
  int iStack_c0;
  int local_bc;
  undefined8 local_b8;
  int local_b0;
  BoxArray *local_a8;
  int local_9c;
  int iStack_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  undefined4 local_5c;
  undefined4 *local_58;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  BoxArray *local_28;
  undefined4 local_1c;
  BoxArray *local_18;
  undefined4 local_c;
  BoxArray *local_8;
  
  local_f0 = ctx;
  local_e8 = this;
  pBVar2 = BoxArray::operator=(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  local_158.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = 0;
  while ((int)local_158.m_simplified_list.
              super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         < 6) {
    local_158.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._0_4_ = FabSet::nComp((FabSet *)0x12f29fb);
    pBVar2 = FabSet::boxArray((FabSet *)0x12f2a47);
    DistributionMap((BndryRegister *)0x12f2a59);
    FabSet::define(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdfc);
    FabSetIter::FabSetIter
              ((FabSetIter *)in_stack_fffffffffffffd90,(FabSet *)in_stack_fffffffffffffd88);
    while (bVar1 = MFIter::isValid((MFIter *)(local_17c + 0x24)), bVar1) {
      in_stack_fffffffffffffd88 = (BoxArray *)local_17c;
      in_stack_fffffffffffffd90 = (BoxArray *)(local_17c + 0x24);
      MFIter::validbox((MFIter *)pBVar2);
      local_17c._28_8_ = in_stack_fffffffffffffd88;
      FabSet::array((FabSet *)in_stack_fffffffffffffd90,(MFIter *)in_stack_fffffffffffffd88);
      FabSet::array((FabSet *)in_stack_fffffffffffffd90,(MFIter *)in_stack_fffffffffffffd88);
      local_d0 = (BoxArray *)local_17c._28_8_;
      local_8 = (BoxArray *)local_17c._28_8_;
      local_c = 0;
      local_c4 = *(int *)local_17c._28_8_;
      local_18 = (BoxArray *)local_17c._28_8_;
      local_1c = 1;
      iStack_c0 = *(int *)(local_17c._28_8_ + 4);
      local_e0 = *(undefined8 *)local_17c._28_8_;
      local_28 = (BoxArray *)local_17c._28_8_;
      local_2c = 2;
      local_d8 = *(int *)(local_17c._28_8_ + 8);
      local_a8 = (BoxArray *)local_17c._28_8_;
      local_38 = (int *)(local_17c._28_8_ + 0xc);
      local_3c = 0;
      local_9c = *local_38;
      local_48 = (undefined4 *)(local_17c._28_8_ + 0xc);
      local_4c = 1;
      iStack_98 = *(int *)(local_17c._28_8_ + 0x10);
      local_b8 = *(undefined8 *)local_38;
      local_58 = (undefined4 *)(local_17c._28_8_ + 0xc);
      local_5c = 2;
      local_b0 = *(int *)(local_17c._28_8_ + 0x14);
      for (local_244 = 0; local_248 = local_d8,
          local_244 <
          (int)local_158.m_simplified_list.
               super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          local_244 = local_244 + 1) {
        for (; local_24c = iStack_c0, local_248 <= local_b0; local_248 = local_248 + 1) {
          for (; local_250 = local_c4, local_24c <= iStack_98; local_24c = local_24c + 1) {
            for (; local_250 <= local_9c; local_250 = local_250 + 1) {
              local_84 = local_250;
              local_88 = local_24c;
              local_8c = local_248;
              local_90 = local_244;
              local_80 = &local_1c0;
              local_6c = local_250;
              local_70 = local_24c;
              local_74 = local_248;
              local_78 = local_244;
              local_68 = &stack0xfffffffffffffe00;
              (&(in_stack_fffffffffffffe00->m_ref).
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)[(long)(local_250 - local_1e0) +
                        (long)(local_24c - local_1dc) * (long)in_stack_fffffffffffffe08 +
                        (long)(local_248 - local_1d8) * (long)in_stack_fffffffffffffe10 +
                        local_244 * local_1e8] =
                   *(element_type **)
                    (local_1c0 +
                    ((long)(local_250 - local_1a0) + (local_24c - local_19c) * local_1b8 +
                     (local_248 - local_198) * local_1b0 + local_244 * local_1a8) * 8);
            }
          }
        }
      }
      local_bc = local_d8;
      local_94 = local_b0;
      MFIter::operator++((MFIter *)(local_17c + 0x24));
    }
    FabSetIter::~FabSetIter((FabSetIter *)0x12f2abb);
    local_158.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ =
         local_158.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_ + 1;
    pBVar2 = (BoxArray *)
             (ulong)local_158.m_simplified_list.
                    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                    ._4_4_;
  }
  return (int)pBVar2;
}

Assistant:

void
BndryRegister::init (const BndryRegister& src)
{
    grids = src.grids;

    for (int idim = 0; idim < 2*AMREX_SPACEDIM; idim++)
    {
        const int ncomp = src.bndry[idim].nComp();
        bndry[idim].define(src.bndry[idim].boxArray(), src.DistributionMap(), ncomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter mfi(src.bndry[idim]); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.validbox();
            auto const sfab = src.bndry[idim].array(mfi);
            auto       dfab =     bndry[idim].array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dfab(i,j,k,n) = sfab(i,j,k,n);
            });
        }
    }
}